

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  MutexLock local_20;
  MutexLock lock;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  lock.mu_ = (Mutex *)type;
  internal::MutexLock::MutexLock(&local_20,&this->prototypes_mutex_);
  pMVar1 = GetPrototypeNoLock(this,(Descriptor *)lock.mu_);
  internal::MutexLock::~MutexLock(&local_20);
  return pMVar1;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}